

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O0

void __thiscall Memory::MarkContext::ProcessTracked(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FinalizableObject *local_18;
  FinalizableObject *trackedObject;
  MarkContext *this_local;
  
  trackedObject = (FinalizableObject *)this;
  bVar2 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack);
  if (!bVar2) {
    while (bVar2 = PageStack<FinalizableObject_*>::Pop(&this->trackStack,&local_18), bVar2) {
      MarkTrackedObject(this,local_18);
    }
    bVar2 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.cpp"
                         ,0x82,"(trackStack.IsEmpty())","trackStack.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    PageStack<FinalizableObject_*>::Release(&this->trackStack);
  }
  return;
}

Assistant:

void MarkContext::ProcessTracked()
{
    if (trackStack.IsEmpty())
    {
        return;
    }

    FinalizableObject * trackedObject;
    while (trackStack.Pop(&trackedObject))
    {
        MarkTrackedObject(trackedObject);
    }

    Assert(trackStack.IsEmpty());

    trackStack.Release();
}